

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenSSLWraper.cpp
# Opt level: O0

int OpenSSLWrapper::SslServerContext::SNI_CB(SSL *ssl,char param_2,void *arg)

{
  bool bVar1;
  __type _Var2;
  code *pcVar3;
  iterator iVar4;
  iterator iVar5;
  iterator iVar6;
  char *pcVar7;
  SSL_CTX *ctx;
  bool local_1ba;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_178;
  byte local_169;
  function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_168;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_148;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_140;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_138;
  byte local_129;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_128;
  reference local_108;
  SslServerContext *it;
  iterator __end2;
  iterator __begin2;
  vector<OpenSSLWrapper::SslServerContext,_std::allocator<OpenSSLWrapper::SslServerContext>_>
  *__range2;
  undefined1 local_c8 [8];
  function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  fnDomainCompare;
  allocator<char> local_69;
  undefined1 local_68 [8];
  string strHostName;
  void *Obj;
  _func_string_ptr_void_ptr *fnForwarder;
  char *szHostName;
  vector<OpenSSLWrapper::SslServerContext,_std::allocator<OpenSSLWrapper::SslServerContext>_>
  *pSslCtx;
  void *arg_local;
  char param_2_local;
  SSL *ssl_local;
  
  fnForwarder = (_func_string_ptr_void_ptr *)SSL_get_servername((SSL *)ssl,0);
  if (fnForwarder == (_func_string_ptr_void_ptr *)0x0) {
    pcVar3 = (code *)SSL_get_ex_data((SSL *)ssl,0);
    strHostName.field_2._8_8_ = SSL_get_ex_data((SSL *)ssl,1);
    if ((pcVar3 != (code *)0x0) && ((void *)strHostName.field_2._8_8_ != (void *)0x0)) {
      (*pcVar3)(strHostName.field_2._8_8_);
      fnForwarder = (_func_string_ptr_void_ptr *)std::__cxx11::string::c_str();
    }
  }
  if ((arg != (void *)0x0) && (fnForwarder != (_func_string_ptr_void_ptr *)0x0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_68,(char *)fnForwarder,&local_69);
    std::allocator<char>::~allocator(&local_69);
    iVar4 = std::begin<std::__cxx11::string>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68
                      );
    iVar5 = std::end<std::__cxx11::string>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68
                      );
    iVar6 = std::begin<std::__cxx11::string>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68
                      );
    fnDomainCompare._M_invoker =
         (_Invoker_type)
         std::
         transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,OpenSSLWrapper::SslServerContext::SNI_CB(ssl_st*,char,void*)::__1>
                   (iVar4._M_current,iVar5._M_current,iVar6._M_current);
    std::__cxx11::string::string((string *)&__range2,(string *)local_68);
    std::function<bool(std::__cxx11::string&)>::
    function<OpenSSLWrapper::SslServerContext::SNI_CB(ssl_st*,char,void*)::__0,void>
              ((function<bool(std::__cxx11::string&)> *)local_c8,
               (anon_class_32_1_9dfb1c04 *)&__range2);
    SNI_CB(ssl_st*,char,void*)::$_0::~__0((__0 *)&__range2);
    __end2 = std::
             vector<OpenSSLWrapper::SslServerContext,_std::allocator<OpenSSLWrapper::SslServerContext>_>
             ::begin((vector<OpenSSLWrapper::SslServerContext,_std::allocator<OpenSSLWrapper::SslServerContext>_>
                      *)arg);
    it = (SslServerContext *)
         std::
         vector<OpenSSLWrapper::SslServerContext,_std::allocator<OpenSSLWrapper::SslServerContext>_>
         ::end((vector<OpenSSLWrapper::SslServerContext,_std::allocator<OpenSSLWrapper::SslServerContext>_>
                *)arg);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<OpenSSLWrapper::SslServerContext_*,_std::vector<OpenSSLWrapper::SslServerContext,_std::allocator<OpenSSLWrapper::SslServerContext>_>_>
                                       *)&it), bVar1) {
      local_108 = __gnu_cxx::
                  __normal_iterator<OpenSSLWrapper::SslServerContext_*,_std::vector<OpenSSLWrapper::SslServerContext,_std::allocator<OpenSSLWrapper::SslServerContext>_>_>
                  ::operator*(&__end2);
      local_129 = 0;
      local_169 = 0;
      pcVar7 = (char *)std::__cxx11::string::operator[]
                                 ((ulong)&(local_108->super_SslContext).m_strCertComName);
      if (*pcVar7 == '^') {
        std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
        basic_regex<std::char_traits<char>,std::allocator<char>>
                  ((basic_regex<char,std::__cxx11::regex_traits<char>> *)&local_128,
                   &(local_108->super_SslContext).m_strCertComName,0x10);
        local_129 = 1;
        bVar1 = std::
                regex_match<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_68,&local_128,0);
        local_1ba = true;
        if (!bVar1) goto LAB_0014b171;
      }
      else {
LAB_0014b171:
        _Var2 = std::operator==(&(local_108->super_SslContext).m_strCertComName,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_68);
        local_1ba = true;
        if (!_Var2) {
          local_140._M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::begin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                         (&(local_108->super_SslContext).m_vstrAltNames);
          local_148._M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::end<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                         (&(local_108->super_SslContext).m_vstrAltNames);
          std::
          function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          ::function(&local_168,
                     (function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                      *)local_c8);
          local_169 = 1;
          local_138 = std::
                      find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::function<bool(std::__cxx11::string&)>>
                                (local_140,local_148,&local_168);
          local_178._M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::end<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                         (&(local_108->super_SslContext).m_vstrAltNames);
          local_1ba = __gnu_cxx::operator!=(&local_138,&local_178);
        }
      }
      if ((local_169 & 1) != 0) {
        std::
        function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
        ::~function(&local_168);
      }
      if ((local_129 & 1) != 0) {
        std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&local_128)
        ;
      }
      if (local_1ba != false) {
        ctx = (SSL_CTX *)SslContext::operator()(&local_108->super_SslContext);
        SSL_set_SSL_CTX((SSL *)ssl,ctx);
        ssl_local._4_4_ = 0;
        bVar1 = true;
        goto LAB_0014b3c9;
      }
      __gnu_cxx::
      __normal_iterator<OpenSSLWrapper::SslServerContext_*,_std::vector<OpenSSLWrapper::SslServerContext,_std::allocator<OpenSSLWrapper::SslServerContext>_>_>
      ::operator++(&__end2);
    }
    bVar1 = false;
LAB_0014b3c9:
    std::
    function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::~function((function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                 *)local_c8);
    std::__cxx11::string::~string((string *)local_68);
    if (bVar1) {
      return ssl_local._4_4_;
    }
  }
  return 3;
}

Assistant:

int SslServerContext::SNI_CB(SSL* ssl, char /*iCmd*/, void* arg)
    {
        vector<SslServerContext>* pSslCtx = static_cast<vector<SslServerContext>*>(arg);

        const char* szHostName = SSL_get_servername(ssl, TLSEXT_NAMETYPE_host_name);

        if (szHostName == nullptr)  // if the host name is not set, the connection was made by IP address, we use the IP of the interface the connection came in, to find the certificate
        {
            const string& (*fnForwarder)(void*) = reinterpret_cast<const string&(*)(void*)>(SSL_get_ex_data(ssl, 0));   // Index 0 = Funktion pointer to a static proxy function
            void* Obj = SSL_get_ex_data(ssl, 1);    // Index 1 is the "this" pointer of the SslTcpSocket how owns the ssl object
            if (fnForwarder != nullptr && Obj != nullptr)
                szHostName = fnForwarder(Obj).c_str(); // We get the IP address of the Interface the connection come in
        }

        if (pSslCtx != nullptr && szHostName != nullptr)
        {
            string strHostName(szHostName);
            transform(begin(strHostName), end(strHostName), begin(strHostName), [](char c) noexcept { return static_cast<char>(::tolower(c)); });

            function<bool(string&)> fnDomainCompare = [strHostName](string& it) -> bool
            {
                if (it[0] == '^')   // we have a regular expression
                    return regex_match(strHostName, regex(it));
                else
                    return it.compare(strHostName) == 0 ? true : false;
            };

            for (auto& it : *pSslCtx)
            {
                if ((it.m_strCertComName[0] == '^' && regex_match(strHostName, regex(it.m_strCertComName))) || it.m_strCertComName == strHostName || find_if(begin(it.m_vstrAltNames), end(it.m_vstrAltNames), fnDomainCompare) != end(it.m_vstrAltNames))
                {
                    SSL_set_SSL_CTX(ssl, it());
                    return SSL_TLSEXT_ERR_OK;
                }
            }
        }

        return SSL_TLSEXT_ERR_NOACK;
    }